

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i64_Extend_i32s(w3Interp *this)

{
  int32_t *piVar1;
  w3Interp *this_local;
  
  piVar1 = w3Stack::i32(&this->super_w3Stack);
  w3Stack::set_i64(&this->super_w3Stack,(long)*piVar1);
  return;
}

Assistant:

INTERP (i64_Extend_i32s)
{
    set_i64 ((int64_t)i32 ());
}